

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O3

bool __thiscall
cmCPackNSISGenerator::GetListOfSubdirectories
          (cmCPackNSISGenerator *this,char *topdir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  unsigned_long uVar3;
  char *pcVar4;
  long *plVar5;
  ulong dindex;
  Directory dir;
  string fullPath;
  allocator<char> local_99;
  Directory local_98;
  string local_90;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_70;
  cmCPackNSISGenerator *local_68;
  char *local_60;
  long *local_58 [2];
  long local_48 [2];
  char *local_38;
  
  local_70 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dirs;
  local_68 = this;
  local_38 = topdir;
  cmsys::Directory::Directory(&local_98);
  local_60 = topdir;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,topdir,(allocator<char> *)local_58);
  cmsys::Directory::Load(&local_98,&local_90);
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  dindex = 0;
  while( true ) {
    uVar3 = cmsys::Directory::GetNumberOfFiles(&local_98);
    if (uVar3 <= dindex) break;
    pcVar4 = cmsys::Directory::GetFile(&local_98,dindex);
    if ((*pcVar4 != '.') || ((pcVar4[1] != '\0' && ((pcVar4[1] != '.' || (pcVar4[2] != '\0')))))) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,local_60,&local_99);
      pcVar4 = (char *)std::__cxx11::string::append((char *)local_58);
      plVar5 = (long *)std::__cxx11::string::append(pcVar4);
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,*plVar5,plVar5[1] + *plVar5);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      bVar2 = cmsys::SystemTools::FileIsDirectory(&local_90);
      if (bVar2) {
        bVar2 = cmsys::SystemTools::FileIsSymlink(&local_90);
        if (!bVar2) {
          GetListOfSubdirectories
                    (local_68,local_90._M_dataplus._M_p,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    dindex = dindex + 1;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            (local_70,&local_38);
  cmsys::Directory::~Directory(&local_98);
  return true;
}

Assistant:

bool cmCPackNSISGenerator::GetListOfSubdirectories(
  const char* topdir, std::vector<std::string>& dirs)
{
  cmsys::Directory dir;
  dir.Load(topdir);
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0) {
      std::string const fullPath =
        std::string(topdir).append("/").append(fileName);
      if (cmsys::SystemTools::FileIsDirectory(fullPath) &&
          !cmsys::SystemTools::FileIsSymlink(fullPath)) {
        if (!this->GetListOfSubdirectories(fullPath.c_str(), dirs)) {
          return false;
        }
      }
    }
  }
  dirs.emplace_back(topdir);
  return true;
}